

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_int_32 png_get_y_offset_pixels(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
      ((info_ptr->valid & 0x100) == 0)) || (info_ptr->offset_unit_type != '\0')) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    png_ptr_local._4_4_ = info_ptr->y_offset;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_int_32 PNGAPI
png_get_y_offset_pixels(png_const_structrp png_ptr, png_const_inforp info_ptr)
{
#ifdef PNG_oFFs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_debug1(1, "in %s retrieval function", "png_get_y_offset_pixels");

      if (info_ptr->offset_unit_type == PNG_OFFSET_PIXEL)
         return (info_ptr->y_offset);
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return (0);
}